

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

size_t eastl::RBTreeGetBlackCount(rbtree_node_base *pNodeTop,rbtree_node_base *pNodeBottom)

{
  size_t local_20;
  size_t nCount;
  rbtree_node_base *pNodeBottom_local;
  rbtree_node_base *pNodeTop_local;
  
  local_20 = 0;
  nCount = (size_t)pNodeBottom;
  while( true ) {
    if (nCount == 0) {
      return local_20;
    }
    if (*(char *)(nCount + 0x18) == '\x01') {
      local_20 = local_20 + 1;
    }
    if ((rbtree_node_base *)nCount == pNodeTop) break;
    nCount = *(size_t *)(nCount + 0x10);
  }
  return local_20;
}

Assistant:

EASTL_API size_t RBTreeGetBlackCount(const rbtree_node_base* pNodeTop, const rbtree_node_base* pNodeBottom)
    {
        size_t nCount = 0;

        for(; pNodeBottom; pNodeBottom = pNodeBottom->mpNodeParent)
        {
            if(pNodeBottom->mColor == kRBTreeColorBlack) 
                ++nCount;

            if(pNodeBottom == pNodeTop) 
                break;
        }

        return nCount;
    }